

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,(char)78>(void)

{
  quaternion<double> ALPHA_00;
  bool bVar1;
  ostream *poVar2;
  quaternion<double> *__x;
  quaternion<double> *__y;
  quaternion<double> *pqVar3;
  void *this;
  reference pvVar4;
  reference pvVar5;
  reference X_00;
  quaternion<double> tmp;
  int32_t AStride;
  int32_t ACOL;
  int32_t AROW;
  int i;
  stringstream ss;
  double BETA;
  quaternion<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffff978;
  undefined1 pv_;
  quaternion<double> *__y_00;
  uniform_real_distribution<double> *in_stack_fffffffffffff980;
  lazy_ostream *prev;
  allocator_type *in_stack_fffffffffffff990;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *this_00;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9a0;
  int32_t in_stack_fffffffffffff9ac;
  quaternion<double> *in_stack_fffffffffffff9b0;
  undefined8 in_stack_fffffffffffff9b8;
  int32_t iVar6;
  undefined8 in_stack_fffffffffffff9c0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9c8;
  undefined8 uVar7;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9d0;
  size_type __n;
  double dVar8;
  basic_cstring<const_char> local_548;
  basic_cstring<const_char> local_538;
  undefined1 local_528 [32];
  undefined8 local_508;
  quaternion<double> *in_stack_fffffffffffffba8;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffbb0;
  undefined1 local_440 [24];
  undefined1 local_428 [16];
  basic_cstring<const_char> local_418;
  double local_408;
  double local_400;
  double local_3f8;
  quaternion<double> *local_3f0;
  double local_3e8;
  double local_3e0;
  double local_3d8;
  double local_3d0;
  double local_3c8;
  double local_3c0;
  double in_stack_fffffffffffffc48;
  quaternion<double> *in_stack_fffffffffffffc50;
  int32_t iVar9;
  int iVar10;
  int iVar11;
  quaternion<double> *pqVar12;
  string local_378 [32];
  stringstream local_358 [16];
  ostream local_348 [376];
  double local_1d0;
  quaternion<double> *local_1c8;
  quaternion<double> *pqStack_1c0;
  lazy_ostream *plStack_1b8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *pvStack_1b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  result_type_conflict1 local_190;
  result_type_conflict1 local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  result_type_conflict1 local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  result_type_conflict1 local_d0;
  result_type_conflict1 local_c8;
  result_type_conflict1 local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e4f5c);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9a0,CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
             ,in_stack_fffffffffffff990);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e4f85);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e4f9a);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9a0,CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
             ,in_stack_fffffffffffff990);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e4fc3);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e4fd8);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9a0,CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998)
             ,in_stack_fffffffffffff990);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1e5001);
  local_78 = local_48;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff978);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff978);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff980,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff978);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_c0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_c8 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_d0 = std::uniform_real_distribution<double>::operator()
                         (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    HAXX::quaternion<double>::quaternion(&local_b0,&local_b8,&local_c0,&local_c8,&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = &local_68;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff978);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffff978);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff980,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff978);
    if (!bVar1) break;
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_120 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_128 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_130 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    HAXX::quaternion<double>::quaternion(&local_110,&local_118,&local_120,&local_128,&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_18;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffff978);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffff978);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff980,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff978);
    iVar6 = (int32_t)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_180 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_188 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_190 = std::uniform_real_distribution<double>::operator()
                          (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    HAXX::quaternion<double>::quaternion(&local_170,&local_178,&local_180,&local_188,&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  genRandom<HAXX::quaternion<double>>();
  local_1d0 = genRandom<double>();
  std::__cxx11::stringstream::stringstream(local_358);
  poVar2 = std::operator<<(local_348,"hblas2_gemv_square_");
  std::operator<<(poVar2,'N');
  std::operator<<(local_348,"Q");
  std::operator<<(local_348,"R");
  std::operator<<(local_348,"_LDSame");
  std::__cxx11::stringstream::str();
  poVar2 = std::operator<<((ostream *)&std::cout,local_378);
  poVar2 = std::operator<<(poVar2," will use");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_378);
  __x = (quaternion<double> *)std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  __y = (quaternion<double> *)HAXX::operator<<(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
  std::ostream::operator<<(__y,std::endl<char,std::char_traits<char>>);
  pqVar3 = (quaternion<double> *)std::operator<<((ostream *)&std::cout,"  BETA = ");
  this = (void *)std::ostream::operator<<(pqVar3,local_1d0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  iVar9 = (int32_t)this;
  __n = 0;
  pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_18,0);
  pvVar5 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](local_48,__n);
  dVar8 = local_1d0;
  __y_00 = local_1c8;
  X_00 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
         operator[](&local_68,__n);
  ALPHA_00._M_imag_i = (double)pvVar4;
  ALPHA_00._M_real = (double)__n;
  ALPHA_00._M_imag_j = (double)pvVar5;
  ALPHA_00._M_imag_k = dVar8;
  pqVar12 = __y_00;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            ((char)((ulong)in_stack_fffffffffffff9c0 >> 0x38),(int32_t)in_stack_fffffffffffff9c0,
             iVar6,ALPHA_00,in_stack_fffffffffffff9b0,in_stack_fffffffffffff9ac,X_00,iVar9,
             (double)CONCAT44(in_stack_fffffffffffff99c,1),pqVar3,(int32_t)__y);
  iVar10 = 0;
  pqVar3 = pqStack_1c0;
  prev = plStack_1b8;
  this_00 = pvStack_1b0;
  while (iVar6 = (int32_t)((ulong)in_stack_fffffffffffffc48 >> 0x20), iVar10 < 100) {
    iVar9 = 0;
    local_3d0 = 0.0;
    local_3d8 = 0.0;
    local_3e0 = 0.0;
    local_3e8 = 0.0;
    iVar11 = iVar10;
    HAXX::quaternion<double>::quaternion
              ((quaternion<double> *)&local_3c8,&local_3d0,&local_3d8,&local_3e0,&local_3e8);
    pvVar4 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_18,(long)(iVar10 + iVar9 * 100));
    std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
              (local_48,0);
    HAXX::HBLAS_DOTUV<double>
              ((int32_t)((ulong)pqVar12 >> 0x20),(quaternion<double> *)CONCAT44(iVar11,iVar10),iVar9
               ,in_stack_fffffffffffffc50,iVar6);
    local_3c8 = local_408;
    local_3c0 = local_400;
    in_stack_fffffffffffffc48 = local_3f8;
    in_stack_fffffffffffffc50 = local_3f0;
    do {
      uVar7 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_418,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)pqVar3);
      boost::unit_test::unit_test_log_t::set_checkpoint(uVar7,&local_418,0x47,local_428);
      HAXX::operator*(__x,__y);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_1a8,(long)iVar11);
      HAXX::operator*(&pqVar3->_M_real,__y_00);
      HAXX::operator+(pqVar3,__y_00);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_68,(long)iVar11);
      HAXX::inv<double>(pvVar4);
      HAXX::operator*(__x,__y);
      local_508 = 0x3ff0000000000000;
      HAXX::operator-(pqVar3,&__y_00->_M_real);
      pv_ = (undefined1)((ulong)__y_00 >> 0x38);
      HAXX::norm<double>(X_00);
      boost::test_tools::assertion_result::assertion_result((assertion_result *)pqVar3,(bool)pv_);
      boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_538,
                 "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )",0x48);
      boost::unit_test::operator<<(prev,(basic_cstring<const_char> *)pqVar3);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                (&local_548,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                 ,0x58);
      __y_00 = (quaternion<double> *)0x0;
      boost::test_tools::tt_detail::report_assertion(local_440,local_528,&local_548,0x47,1,0);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)0x1e5ba3);
      boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1e5bb0);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
    } while (bVar1);
    iVar10 = iVar11 + 1;
  }
  std::__cxx11::stringstream::~stringstream(local_358);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            (this_00);
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}